

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O0

ostream * __thiscall Polynomial::debug_display(Polynomial *this,ostream *o)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  void *pvVar5;
  const_reference pvVar6;
  reference piVar7;
  const_iterator cStack_40;
  int a;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int local_20;
  int i_2;
  int i_1;
  int i;
  ostream *o_local;
  Polynomial *this_local;
  
  poVar3 = std::operator<<(o,"Polynomial: numstates=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->mNumStates);
  poVar3 = std::operator<<(poVar3," numvars=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->mNumVariables);
  poVar3 = std::operator<<(poVar3," evalValuesLength=");
  sVar4 = std::vector<int,_std::allocator<int>_>::size(&this->mEvaluationValues);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
  poVar3 = std::operator<<(poVar3," resultLoc=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->mResultLocation);
  poVar3 = std::operator<<(poVar3," firstOp=");
  pvVar5 = (void *)std::ostream::operator<<(poVar3,this->mFirstOperation);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(o," program: ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  for (i_2 = 0; i_2 < this->mNumStates; i_2 = i_2 + 1) {
    poVar3 = std::operator<<(o,"    ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,i_2);
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,i_2);
    poVar3 = std::operator<<(poVar3," (constant)");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  for (local_20 = 0; local_20 < this->mNumVariables; local_20 = local_20 + 1) {
    poVar3 = std::operator<<(o,"    ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20 + this->mNumStates);
    poVar3 = std::operator<<(poVar3," = x");
    pvVar5 = (void *)std::ostream::operator<<(poVar3,local_20);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  for (__range2._4_4_ = 0;
      sVar4 = std::vector<Polynomial::operand,_std::allocator<Polynomial::operand>_>::size
                        (&this->mOperands), (ulong)(long)__range2._4_4_ < sVar4;
      __range2._4_4_ = __range2._4_4_ + 1) {
    poVar3 = std::operator<<(o,"    ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->mFirstOperation + __range2._4_4_);
    std::operator<<(poVar3," = ");
    pvVar6 = std::vector<Polynomial::operand,_std::allocator<Polynomial::operand>_>::operator[]
                       (&this->mOperands,(long)__range2._4_4_);
    switch(pvVar6->op) {
    case PLUS:
      std::operator<<(o,"PLUS");
      break;
    case TIMES:
      std::operator<<(o,"TIMES");
      break;
    case POWER:
      std::operator<<(o,"POWER");
      break;
    case NOT:
      std::operator<<(o,"NOT");
      break;
    case MAX:
      std::operator<<(o,"MAX");
      break;
    case MIN:
      std::operator<<(o,"MIN");
    }
    pvVar6 = std::vector<Polynomial::operand,_std::allocator<Polynomial::operand>_>::operator[]
                       (&this->mOperands,(long)__range2._4_4_);
    __end2 = std::vector<int,_std::allocator<int>_>::begin(&pvVar6->args);
    cStack_40 = std::vector<int,_std::allocator<int>_>::end(&pvVar6->args);
    while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc0), bVar2) {
      piVar7 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      iVar1 = *piVar7;
      poVar3 = std::operator<<(o," ");
      std::ostream::operator<<(poVar3,iVar1);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    std::ostream::operator<<(o,std::endl<char,std::char_traits<char>>);
  }
  return o;
}

Assistant:

std::ostream& Polynomial::debug_display(std::ostream& o) const
{
  o << "Polynomial: numstates=" << mNumStates
    << " numvars=" << mNumVariables
    << " evalValuesLength=" << mEvaluationValues.size()
    << " resultLoc=" << mResultLocation
    << " firstOp=" << mFirstOperation << std::endl;
  o << " program: " << std::endl;
  for (int i=0; i<mNumStates; i++)
    o << "    " << i << " = " << i << " (constant)" << std::endl;
  for (int i=0; i<mNumVariables; i++)
    o << "    " << i+mNumStates << " = x" << i << std::endl;
  for (int i=0; i < mOperands.size(); i++)
    {
      o << "    " << mFirstOperation+i << " = ";
      switch (mOperands[i].op)
        {
        case operandType::PLUS:
          o << "PLUS";
          break;
        case operandType::TIMES:
          o << "TIMES";
          break;
        case operandType::POWER:
          o << "POWER";
          break;
        case operandType::MAX:
          o << "MAX";
          break;
        case operandType::MIN:
          o << "MIN";
          break;
        case operandType::NOT:
          o << "NOT";
          break;
        }
      for (auto a : mOperands[i].args)
        o << " " << a;
      o << std::endl;
      // o << " " << mOperands[i].first_arg << " " << mOperands[i].second_arg << std::endl;
    }
  return o;
}